

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
boost::unit_test::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,basic_cstring<const_char> *str)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,str->m_begin,str->m_end);
  std::operator<<(os,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return os;
}

Assistant:

inline std::basic_ostream<CharT1,Tr>&
operator<<( std::basic_ostream<CharT1,Tr>& os, basic_cstring<CharT2> const& str )
{
    CharT1 const* const beg = reinterpret_cast<CharT1 const*>( str.begin() ); // !!
    CharT1 const* const end = reinterpret_cast<CharT1 const*>( str.end() );
    os << std::basic_string<CharT1,Tr>( beg, end - beg );

    return os;
}